

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitSphere(SemanticParser *this,SP *shape)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  float fVar13;
  SP SVar14;
  SP ours;
  undefined1 local_89;
  Sphere *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined1 local_78 [32];
  SP local_58;
  SP local_48;
  _Base_ptr local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_38 = *(_Base_ptr *)(*in_RDX + 0x58);
  local_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x60);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_78,(SP *)shape);
  local_88 = (Sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Sphere,std::allocator<pbrt::Sphere>,std::shared_ptr<pbrt::Material>>
            (&_Stack_80,&local_88,(allocator<pbrt::Sphere> *)&local_89,
             (shared_ptr<pbrt::Material> *)local_78);
  std::__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::Sphere,pbrt::Sphere>
            ((__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2> *)&local_88,local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  lVar1 = *in_RDX;
  uVar2 = *(undefined4 *)(lVar1 + 0x78);
  fVar13 = *(float *)(lVar1 + 0x7c);
  uVar3 = *(undefined4 *)(lVar1 + 0x80);
  fVar4 = *(float *)(lVar1 + 0x84);
  fVar5 = *(float *)(lVar1 + 0x88);
  fVar6 = *(float *)(lVar1 + 0x8c);
  fVar7 = *(float *)(lVar1 + 0x90);
  fVar8 = *(float *)(lVar1 + 0x94);
  fVar9 = *(float *)(lVar1 + 0x9c);
  fVar10 = *(float *)(lVar1 + 0xa0);
  fVar11 = *(float *)(lVar1 + 0xa4);
  (local_88->transform).l.vz.z = *(float *)(lVar1 + 0x98);
  (local_88->transform).p.x = fVar9;
  (local_88->transform).p.y = fVar10;
  (local_88->transform).p.z = fVar11;
  (local_88->transform).l.vy.y = fVar5;
  (local_88->transform).l.vy.z = fVar6;
  (local_88->transform).l.vz.x = fVar7;
  (local_88->transform).l.vz.y = fVar8;
  (local_88->transform).l.vx.x = (float)uVar2;
  (local_88->transform).l.vx.y = fVar13;
  *(undefined4 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_88->transform).l.vx.z)->_M_pi = uVar3;
  (local_88->transform).l.vy.x = fVar4;
  lVar1 = *in_RDX;
  local_78._0_8_ = (element_type *)(local_78 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"radius","");
  fVar13 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),(string *)local_78,0.0);
  local_88->radius = fVar13;
  if ((element_type *)local_78._0_8_ != (element_type *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
  }
  local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_88->super_Shape;
  local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_80._M_pi;
  if ((_Base_ptr)_Stack_80._M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_48,&local_58);
  _Var12._M_pi = extraout_RDX;
  if (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var12._M_pi = extraout_RDX_00;
  }
  if ((_Base_ptr)
      local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var12._M_pi = extraout_RDX_01;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_80._M_pi;
  SVar14.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  SVar14.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar14.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitSphere(pbrt::syntactic::Shape::SP shape)
  {
    Sphere::SP ours = std::make_shared<Sphere>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
    extractTextures(ours,shape);
      
    return ours;
  }